

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

string * __thiscall
polyscope::deviceBufferTypeName_abi_cxx11_
          (string *__return_storage_ptr__,polyscope *this,DeviceBufferType *d)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(*(undefined4 *)this) {
  case 0:
    pcVar2 = "Attribute";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "Texture1d";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "Texture2d";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "Texture3d";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string deviceBufferTypeName(const DeviceBufferType& d) {
  switch (d) {
  case DeviceBufferType::Attribute:
    return "Attribute";
  case DeviceBufferType::Texture1d:
    return "Texture1d";
  case DeviceBufferType::Texture2d:
    return "Texture2d";
  case DeviceBufferType::Texture3d:
    return "Texture3d";
  }
  return "";
}